

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

VFSNode __thiscall VFS::CVFS::CVFSDir::Copy(CVFSDir *this)

{
  CVFSDir *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CVFSDir *in_RSI;
  VFSNode VVar1;
  shared_ptr<VFS::CVFS::CVFSDir> local_28;
  CVFSDir *this_local;
  
  this_local = this;
  this_00 = (CVFSDir *)operator_new(0x80);
  CVFSDir(this_00,in_RSI);
  std::shared_ptr<VFS::CVFS::CVFSDir>::shared_ptr<VFS::CVFS::CVFSDir,void>(&local_28,this_00);
  std::shared_ptr<VFS::CVFSNode>::shared_ptr<VFS::CVFS::CVFSDir,void>
            ((shared_ptr<VFS::CVFSNode> *)this,&local_28);
  std::shared_ptr<VFS::CVFS::CVFSDir>::~shared_ptr(&local_28);
  VVar1.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar1.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_CVFSNode
  ;
  return (VFSNode)VVar1.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VFSNode Copy() override
                    {
                        return VFSDir(new CVFSDir(*this));
                    }